

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

QueryId __thiscall
helics::Federate::queryAsync
          (Federate *this,string_view target,string_view queryStr,HelicsSequencingModes mode)

{
  string_view message;
  uint val;
  size_t sVar1;
  AsyncFedCallInfo *pAVar2;
  undefined8 in_RDX;
  type *in_RSI;
  IdentifierId<unsigned_int,_(helics::Identifiers)113,_4294967295U> *in_RDI;
  int cnt;
  handle asyncInfo;
  future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> queryFut;
  shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *in_stack_ffffffffffffff08;
  lock_handle<helics::AsyncFedCallInfo,_std::mutex> *this_00;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff20;
  IdentifierId<unsigned_int,_(helics::Identifiers)113,_4294967295U> *this_01;
  lock_handle<helics::AsyncFedCallInfo,_std::mutex> local_98;
  
  if (((in_RSI->target)._M_len & 0x1000000000000) != 0) {
    sVar1 = __cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff20,
               (char *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
    message._M_str = (char *)in_RDI;
    message._M_len = sVar1;
    InvalidFunctionCall::InvalidFunctionCall
              ((InvalidFunctionCall *)in_stack_ffffffffffffff20,message);
    __cxa_throw(sVar1,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
  }
  this_01 = in_RDI;
  std::
  async_abi_cxx11_<helics::Federate::queryAsync(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,HelicsSequencingModes)::__0>
            ((launch)((ulong)in_RDX >> 0x20),in_RSI);
  std::
  unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
  ::operator->((unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
                *)0x2656d0);
  gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>::lock
            (in_stack_ffffffffffffff08);
  this_00 = &local_98;
  pAVar2 = gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::operator->(this_00);
  val = std::__atomic_base<int>::operator++(&(pAVar2->queryCounter).super___atomic_base<int>,0);
  gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::operator->(this_00);
  std::
  map<int,std::future<std::__cxx11::string>,std::less<int>,std::allocator<std::pair<int_const,std::future<std::__cxx11::string>>>>
  ::emplace<int&,std::future<std::__cxx11::string>>
            ((map<int,_std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)in_stack_ffffffffffffff20,
             (int *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
             (future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_00);
  IdentifierId<unsigned_int,_(helics::Identifiers)113,_4294967295U>::IdentifierId(this_01,val);
  gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::~lock_handle
            ((lock_handle<helics::AsyncFedCallInfo,_std::mutex> *)0x265758);
  std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~future((future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x265765);
  return (QueryId)(uint)in_RDI;
}

Assistant:

QueryId Federate::queryAsync(std::string_view target,
                             std::string_view queryStr,
                             HelicsSequencingModes mode)
{
    if (singleThreadFederate) {
        throw(helics::InvalidFunctionCall("No Async calls are allowed in single thread federates"));
    }
    auto queryFut = std::async(std::launch::async, [this, target, queryStr, mode]() {
        return coreObject->query(target, queryStr, mode);
    });
    auto asyncInfo = asyncCallInfo->lock();
    int cnt = asyncInfo->queryCounter++;

    asyncInfo->inFlightQueries.emplace(cnt, std::move(queryFut));
    return QueryId(cnt);
}